

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_redaction.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestNestedMessageEnum::ByteSizeLong(TestNestedMessageEnum *this)

{
  RepeatedField<int> *value;
  anon_union_40_1_493b367e_for_TestNestedMessageEnum_3 aVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  value = &(this->field_0)._impl_.direct_enum_;
  sVar3 = google::protobuf::internal::WireFormatLite::EnumSize(value);
  uVar2 = google::protobuf::RepeatedField<int>::size(value);
  sVar3 = uVar2 + sVar3;
  aVar1 = this->field_0;
  if (((undefined1  [40])aVar1 & (undefined1  [40])0x3) != (undefined1  [40])0x0) {
    if (((undefined1  [40])aVar1 & (undefined1  [40])0x1) != (undefined1  [40])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::StringSize
                        ((string *)
                         ((ulong)(this->field_0)._impl_.redacted_string_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc));
      sVar3 = sVar3 + sVar4 + 1;
    }
    if (((undefined1  [40])aVar1 & (undefined1  [40])0x2) != (undefined1  [40])0x0) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestMessageEnum>((this->field_0)._impl_.nested_enum_);
      sVar3 = sVar3 + sVar4 + 1;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t TestNestedMessageEnum::ByteSizeLong() const {
  const TestNestedMessageEnum& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestNestedMessageEnum)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.MetaAnnotatedEnum direct_enum = 1;
    {
      ::size_t data_size =
          ::_pbi::WireFormatLite::EnumSize(this_._internal_direct_enum());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_direct_enum_size());
      total_size += data_size + tag_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // string redacted_string = 3 [debug_redact = true];
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 + ::google::protobuf::internal::WireFormatLite::StringSize(
                                      this_._internal_redacted_string());
    }
    // .proto2_unittest.TestMessageEnum nested_enum = 2;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.nested_enum_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}